

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O1

int AF_A_Punch(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *this;
  undefined8 *puVar2;
  AWeapon *this_00;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  void *pvVar9;
  AInventory *pAVar10;
  VMValue *pVVar11;
  char *__assertion;
  bool bVar12;
  FTranslatedLineTarget t;
  FSoundID local_74;
  FName local_70;
  FName local_6c;
  undefined1 local_68 [32];
  FTranslatedLineTarget local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00592833;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    this = (AActor *)(param->field_0).field_1.a;
    pVVar11 = param;
    uVar5 = numparam;
    if (this != (AActor *)0x0) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar8 = (this->super_DThinker).super_DObject.Class;
      bVar12 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar12;
      uVar5 = (uint)bVar12;
      pVVar11 = (VMValue *)(ulong)(pPVar8 == pPVar3 || bVar12);
      if (pPVar8 != pPVar3 && !bVar12) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_00592833;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_00592808;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar7 = (**(code **)*puVar2)(puVar2,pVVar11,uVar5,ret);
          puVar2[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar2[1];
        bVar12 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar3 && bVar12) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar12 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar3) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar12) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00592833;
        }
      }
    }
    if ((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) {
      pvVar9 = (void *)0x0;
    }
    else {
      if ((VVar1 != '\x03') ||
         ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))) {
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
        ;
        goto LAB_00592833;
      }
      pvVar9 = param[2].field_0.field_1.a;
    }
    if ((((this->player != (player_t *)0x0) &&
         (this_00 = this->player->ReadyWeapon, this_00 != (AWeapon *)0x0)) &&
        (pvVar9 != (void *)0x0 && ((this_00->super_AInventory).field_0x4de & 1) == 0)) &&
       ((*(int *)((long)pvVar9 + 8) == 1 &&
        (bVar12 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,-1), !bVar12)))) {
      return 0;
    }
    uVar5 = FRandom::GenRand32(&pr_punch);
    uVar5 = (uVar5 & 0xff) % 10;
    pAVar10 = AActor::FindInventory
                        (this,(PClassActor *)APowerStrength::RegistrationInfo.MyClass,false);
    iVar4 = (uVar5 * 4 + 4) * 5;
    if (pAVar10 == (AInventory *)0x0) {
      iVar4 = uVar5 * 2 + 2;
    }
    uVar5 = FRandom::GenRand32(&pr_punch);
    uVar6 = FRandom::GenRand32(&pr_punch);
    pPVar3 = (PClass *)
             ((double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.02197265625 +
             (this->Angles).Yaw.Degrees);
    local_68._16_8_ = (DObject *)0x0;
    local_68._24_8_ = pPVar3;
    P_AimLineAttack((AActor *)local_68,(DAngle *)this,64.0,
                    (FTranslatedLineTarget *)(local_68 + 0x18),(DAngle *)0x0,(int)local_68 + 0x10,
                    (AActor *)0x0,(AActor *)0x0);
    local_6c.Index = 0x84;
    local_70.Index = 0x40;
    local_68._8_8_ = pPVar3;
    P_LineAttack(this,(DAngle *)(local_68 + 8),64.0,(DAngle *)local_68,iVar4,&local_6c,&local_70,1,
                 &local_48,(int *)0x0);
    if (local_48.linetarget != (AActor *)0x0) {
      local_74.ID = S_FindSound("*fist");
      S_Sound(this,1,&local_74,1.0,1.0);
      (this->Angles).Yaw.Degrees = local_48.angleFromSource.Degrees;
    }
    return 0;
  }
LAB_00592808:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00592833:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                ,0x1f,"int AF_A_Punch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Punch)
{
	PARAM_ACTION_PROLOGUE;

	DAngle 	angle;
	int 		damage;
	DAngle 		pitch;
	FTranslatedLineTarget t;

	if (self->player != NULL)
	{
		AWeapon *weapon = self->player->ReadyWeapon;
		if (weapon != NULL && !(weapon->WeaponFlags & WIF_DEHAMMO) && ACTION_CALL_FROM_PSPRITE())
		{
			if (!weapon->DepleteAmmo (weapon->bAltFire))
				return 0;
		}
	}

	damage = (pr_punch()%10+1)<<1;

	if (self->FindInventory<APowerStrength>())	
		damage *= 10;

	angle = self->Angles.Yaw + pr_punch.Random2() * (5.625 / 256);
	pitch = P_AimLineAttack (self, angle, MELEERANGE);

	P_LineAttack (self, angle, MELEERANGE, pitch, damage, NAME_Melee, NAME_BulletPuff, LAF_ISMELEEATTACK, &t);

	// turn to face target
	if (t.linetarget)
	{
		S_Sound (self, CHAN_WEAPON, "*fist", 1, ATTN_NORM);
		self->Angles.Yaw = t.angleFromSource;
	}
	return 0;
}